

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_shdr_chunk.cpp
# Opt level: O0

void __thiscall sf2cute::SFRIFFShdrChunk::Write(SFRIFFShdrChunk *this,ostream *out)

{
  undefined8 uVar1;
  int iVar2;
  uint32_t start_loop_00;
  uint32_t end;
  uint16_t link_00;
  ostream *poVar3;
  bool bVar4;
  uint8_t original_key;
  int8_t correction;
  SFSampleLink type;
  uint32_t uVar5;
  uint32_t sample_rate;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  *this_00;
  element_type *peVar6;
  unordered_map<const_sf2cute::SFSample_*,_unsigned_short,_std::hash<const_sf2cute::SFSample_*>,_std::equal_to<const_sf2cute::SFSample_*>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>_>
  *puVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  out_of_range *this_01;
  vector<short,_std::allocator<short>_> *pvVar10;
  size_type sVar11;
  length_error *this_02;
  string *name;
  char *__to;
  exception *anon_var_0;
  string local_f8;
  ulong local_d8;
  size_t end_loop;
  size_t start_loop;
  size_t end_sample;
  element_type *local_b8;
  undefined1 local_b0 [24];
  shared_ptr<sf2cute::SFSample> *link;
  __shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_90;
  uint16_t link_index;
  shared_ptr<sf2cute::SFSample> *sample;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  *__range2;
  size_t start_sample;
  string local_58;
  undefined4 local_34;
  ostream *poStack_30;
  iostate old_exception_bits;
  ostream *out_local;
  SFRIFFShdrChunk *this_local;
  
  poStack_30 = out;
  out_local = (ostream *)this;
  local_34 = std::ios::exceptions();
  uVar1 = *(undefined8 *)(*(long *)poStack_30 + -0x18);
  iVar2 = (int)poStack_30;
  std::operator|(_S_badbit,_S_failbit);
  std::ios::exceptions(iVar2 + (int)uVar1);
  poVar3 = poStack_30;
  (*(this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface[2])(&local_58);
  RIFFChunk::WriteHeader(poVar3,&local_58,this->size_);
  std::__cxx11::string::~string((string *)&local_58);
  __range2 = (vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
              *)0x0;
  this_00 = samples(this);
  __end2 = std::
           vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ::begin(this_00);
  sample = (shared_ptr<sf2cute::SFSample> *)
           std::
           vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ::end(this_00);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
                                *)&sample);
    poVar3 = poStack_30;
    if (!bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"EOS",(allocator<char> *)((long)&anon_var_0 + 7));
      WriteItem(poVar3,&local_f8,0,0,0,0,0,'\0','\0',0,0);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      if ((this->size_ & 1) != 0) {
        InsertInt8<std::ostream>(poStack_30,'\0');
      }
      return;
    }
    p_Stack_90 = (__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
                  ::operator*(&__end2);
    link._6_2_ = 0;
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    bVar4 = SFSample::has_link(peVar6);
    if (bVar4) {
      peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Stack_90);
      SFSample::link((SFSample *)local_b0,(char *)peVar6,__to);
      local_b0._16_8_ = (SFSample *)local_b0;
      puVar7 = sample_index_map(this);
      local_b8 = std::__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *)
                            local_b0._16_8_);
      sVar8 = std::
              unordered_map<const_sf2cute::SFSample_*,_unsigned_short,_std::hash<const_sf2cute::SFSample_*>,_std::equal_to<const_sf2cute::SFSample_*>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>_>
              ::count(puVar7,&local_b8);
      if (sVar8 == 0) {
        this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_01,"Sample has a link to an unknown sample.");
        __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      puVar7 = sample_index_map(this);
      end_sample = (size_t)std::__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::get
                                     ((__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *
                                      )local_b0._16_8_);
      pmVar9 = std::
               unordered_map<const_sf2cute::SFSample_*,_unsigned_short,_std::hash<const_sf2cute::SFSample_*>,_std::equal_to<const_sf2cute::SFSample_*>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>_>
               ::at(puVar7,(key_type *)&end_sample);
      link._6_2_ = *pmVar9;
      std::shared_ptr<sf2cute::SFSample>::~shared_ptr((shared_ptr<sf2cute::SFSample> *)local_b0);
    }
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    pvVar10 = SFSample::data(peVar6);
    sVar11 = std::vector<short,_std::allocator<short>_>::size(pvVar10);
    start_loop = (long)&(__range2->
                        super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + sVar11;
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    uVar5 = SFSample::start_loop(peVar6);
    end_loop = (long)&(__range2->
                      super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar5;
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    uVar5 = SFSample::end_loop(peVar6);
    poVar3 = poStack_30;
    local_d8 = (long)&(__range2->
                      super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar5;
    if (((((vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
            *)0xffffffff < __range2) || (0xffffffff < start_loop)) || (0xffffffff < end_loop)) ||
       (0xffffffff < local_d8)) break;
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    name = SFSample::name_abi_cxx11_(peVar6);
    end = (uint32_t)start_loop;
    start_loop_00 = (uint32_t)end_loop;
    uVar5 = (uint32_t)local_d8;
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    sample_rate = SFSample::sample_rate(peVar6);
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    original_key = SFSample::original_key(peVar6);
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    correction = SFSample::correction(peVar6);
    link_00 = link._6_2_;
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    type = SFSample::type(peVar6);
    WriteItem(poVar3,name,(uint32_t)__range2,end,start_loop_00,uVar5,sample_rate,original_key,
              correction,link_00,type);
    peVar6 = std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Stack_90);
    pvVar10 = SFSample::data(peVar6);
    sVar11 = std::vector<short,_std::allocator<short>_>::size(pvVar10);
    __range2 = (vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                *)((long)&__range2[1].
                          super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + sVar11 + 6);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
    ::operator++(&__end2);
  }
  this_02 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_02,"Too many sample datapoints.");
  __cxa_throw(this_02,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void SFRIFFShdrChunk::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk header.
    RIFFChunk::WriteHeader(out, name(), size_);

    // Sample headers:
    size_t start_sample = 0;
    for (const auto & sample : samples()) {
      // Find the linked sample.
      uint16_t link_index = 0;
      if (sample->has_link()) {
        const auto & link = sample->link();
        if (sample_index_map().count(link.get()) != 0) {
          link_index = sample_index_map().at(link.get());
        }
        else {
          throw std::out_of_range("Sample has a link to an unknown sample.");
        }
      }

      // Calculate the sample indices.
      size_t end_sample = start_sample + sample->data().size();
      size_t start_loop = start_sample + sample->start_loop();
      size_t end_loop = start_sample + sample->end_loop();

      // Check the range of indices.
      if (start_sample > UINT32_MAX || end_sample > UINT32_MAX ||
          start_loop > UINT32_MAX || end_loop > UINT32_MAX) {
        throw std::length_error("Too many sample datapoints.");
      }

      // Write the sample header.
      WriteItem(out,
        sample->name(),
        uint32_t(start_sample),
        uint32_t(end_sample),
        uint32_t(start_loop),
        uint32_t(end_loop),
        sample->sample_rate(),
        sample->original_key(),
        sample->correction(),
        link_index,
        sample->type());

      // Calculate the next sample index.
      start_sample += sample->data().size() + SFSample::kTerminatorSampleLength;
    }

    // Write the last terminator item.
    WriteItem(out, "EOS", 0, 0, 0, 0, 0, 0, 0, 0, SFSampleLink(0));

    // Write a padding byte if necessary.
    if (size_ % 2 != 0) {
      InsertInt8(out, 0);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}